

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O1

string * squall::detail::
         TypeMaskList<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ::doit(void)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string *in_RDI;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_28 = 0;
  local_20[0] = 0;
  local_30 = local_20;
  plVar2 = (long *)std::__cxx11::string::insert((ulong)&local_30,0,'\x01');
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar3;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return in_RDI;
}

Assistant:

static string doit() {
        return typemask<H>() + TypeMaskList<T...>::doit();
    }